

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

void __thiscall IlmThread_2_5::ThreadPool::ThreadPool(ThreadPool *this,uint nthreads)

{
  __pointer_type pTVar1;
  Data *this_00;
  DefaultThreadPoolProvider *this_01;
  __pointer_type pTVar2;
  __pointer_type pTVar3;
  
  this->_vptr_ThreadPool = (_func_int **)&PTR__ThreadPool_00108c10;
  this_00 = (Data *)operator_new(0x10);
  Data::Data(this_00);
  this->_data = this_00;
  if (nthreads == 0) {
    pTVar2 = (__pointer_type)operator_new(8);
    pTVar2->_vptr_ThreadPoolProvider = (_func_int **)&PTR__ThreadPoolProvider_00108c90;
    pTVar1 = (this_00->provider)._M_b._M_p;
    LOCK();
    pTVar3 = (this_00->provider)._M_b._M_p;
    if (pTVar1 == pTVar3) {
      (this_00->provider)._M_b._M_p = pTVar2;
      pTVar3 = pTVar1;
    }
    UNLOCK();
    while (0 < (this_00->provUsers).super___atomic_base<int>._M_i) {
      sched_yield();
    }
  }
  else {
    this_01 = (DefaultThreadPoolProvider *)operator_new(0xe0);
    anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider(this_01,nthreads);
    pTVar1 = (this_00->provider)._M_b._M_p;
    LOCK();
    pTVar3 = (this_00->provider)._M_b._M_p;
    if (pTVar1 == pTVar3) {
      (this_00->provider)._M_b._M_p = (__pointer_type)this_01;
      pTVar3 = pTVar1;
    }
    UNLOCK();
    while (0 < (this_00->provUsers).super___atomic_base<int>._M_i) {
      sched_yield();
    }
  }
  if (pTVar3 == (__pointer_type)0x0) {
    return;
  }
  (*pTVar3->_vptr_ThreadPoolProvider[5])(pTVar3);
  (*pTVar3->_vptr_ThreadPoolProvider[1])(pTVar3);
  return;
}

Assistant:

ThreadPool::ThreadPool (unsigned nthreads):
    _data (new Data)
{
    if ( nthreads == 0 )
        _data->setProvider( new NullThreadPoolProvider );
    else
        _data->setProvider( new DefaultThreadPoolProvider( int(nthreads) ) );
}